

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall
chrono::curiosity::CuriosityPart::CuriosityPart
          (CuriosityPart *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,bool collide)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ChQuaternion<double> local_50;
  
  this->_vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_0017e8d0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)&(this->m_mesh_name).field_2;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  (this->m_mesh_xform)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  (this->m_mesh_xform).coord.pos.m_data[0] = 0.0;
  (this->m_mesh_xform).coord.pos.m_data[1] = 0.0;
  (this->m_mesh_xform).coord.pos.m_data[2] = 0.0;
  (this->m_mesh_xform).coord.rot.m_data[0] = 1.0;
  (this->m_mesh_xform).coord.rot.m_data[1] = 0.0;
  (this->m_mesh_xform).coord.rot.m_data[2] = 0.0;
  (this->m_mesh_xform).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->m_mesh_xform).Amatrix,&local_50);
  (this->m_color).R = 1.0;
  (this->m_color).G = 1.0;
  (this->m_color).B = 1.0;
  (this->m_pos)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  (this->m_pos).coord.pos.m_data[0] = (rel_pos->coord).pos.m_data[0];
  (this->m_pos).coord.pos.m_data[1] = (rel_pos->coord).pos.m_data[1];
  (this->m_pos).coord.pos.m_data[2] = (rel_pos->coord).pos.m_data[2];
  (this->m_pos).coord.rot.m_data[0] = (rel_pos->coord).rot.m_data[0];
  (this->m_pos).coord.rot.m_data[1] = (rel_pos->coord).rot.m_data[1];
  (this->m_pos).coord.rot.m_data[2] = (rel_pos->coord).rot.m_data[2];
  (this->m_pos).coord.rot.m_data[3] = (rel_pos->coord).rot.m_data[3];
  dVar3 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar4 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar5 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar6 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar7 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar8 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar9 = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       dVar3;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = dVar4;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = dVar5;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = dVar6;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = dVar7;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = dVar8;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = dVar9;
  *(double *)
   ((long)(this->m_pos).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = (rel_pos->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (this->m_inertia).m_data[0] = 0.0;
  (this->m_inertia).m_data[1] = 0.0;
  (this->m_inertia).m_data[2] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  (this->m_cog)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  (this->m_cog).coord.pos.m_data[0] = 0.0;
  (this->m_cog).coord.pos.m_data[1] = 0.0;
  (this->m_cog).coord.pos.m_data[2] = 0.0;
  (this->m_cog).coord.rot.m_data[0] = 1.0;
  (this->m_cog).coord.rot.m_data[1] = 0.0;
  (this->m_cog).coord.rot.m_data[2] = 0.0;
  (this->m_cog).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->m_cog).Amatrix,&local_50);
  this->m_visualize = true;
  this->m_collide = collide;
  return;
}

Assistant:

CuriosityPart::CuriosityPart(const std::string& name,
                             const ChFrame<>& rel_pos,
                             std::shared_ptr<ChMaterialSurface> mat,
                             bool collide)
    : m_name(name), m_pos(rel_pos), m_mat(mat), m_collide(collide), m_visualize(true) {}